

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  *(undefined8 *)&this[-1].field_0x70 = 0x8a2850;
  *(undefined8 *)&this->field_0x58 = 0x8a2968;
  *(undefined8 *)&this[-1].field_0xf8 = 0x8a2878;
  *(undefined8 *)&this[-1].field_0x108 = 0x8a28a0;
  *(undefined8 *)&this[-1].field_0x140 = 0x8a28c8;
  *(undefined8 *)&this[-1].field_0x170 = 0x8a28f0;
  *(undefined8 *)&this[-1].field_0x1a8 = 0x8a2918;
  *(undefined8 *)this = 0x8a2940;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x70,&PTR_construction_vtable_24__008a2988);
  operator_delete(&this[-1].field_0x70,0x1b8);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}